

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i a;
  __m256i alVar23;
  __m256i alVar24;
  __m256i alVar25;
  __m256i alVar26;
  __m256i alVar27;
  __m256i alVar28;
  __m256i alVar29;
  __m256i c;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  __m256i vH_04;
  __m256i vH_05;
  __m256i vH_06;
  __m256i vH_07;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  __m256i *palVar34;
  __m256i *palVar35;
  __m256i *palVar36;
  __m256i *palVar37;
  __m256i *palVar38;
  __m256i *palVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  long lVar43;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  int32_t temp;
  int32_t column_len;
  int32_t *l;
  int32_t *s;
  int32_t *m;
  int32_t *t;
  __m256i *tmp_15;
  __m256i *tmp_14;
  __m256i *tmp_13;
  __m256i *tmp_12;
  __m256i *tmp_11;
  __m256i *tmp_10;
  __m256i *tmp_9;
  __m256i *tmp_8;
  __m256i vCompare;
  __m256i cond;
  __m256i case2_1;
  __m256i case1_1;
  __m256i vHp;
  __m256i case2;
  __m256i case1;
  __m256i cond_zero;
  __m256i *tmp_7;
  __m256i *tmp_6;
  __m256i *tmp_5;
  __m256i *tmp_4;
  __m256i *tmp_3;
  __m256i *tmp_2;
  __m256i *tmp_1;
  __m256i *tmp;
  __m256i *vPS;
  __m256i *vPM;
  __m256i *vP;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH_dag;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_ext;
  __m256i vF;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_ext;
  __m256i vE;
  __m256i vEF_opn;
  parasail_result_t *result;
  int32_t maxp;
  __m256i vPosLimit;
  __m256i vSaturationCheckMax;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m256i vOne;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvHLLoad;
  __m256i *pvHLStore;
  __m256i *pvHSLoad;
  __m256i *pvHSStore;
  __m256i *pvHMLoad;
  __m256i *pvHMStore;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfileS;
  __m256i *vProfileM;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined8 in_stack_ffffffffffffe080;
  int32_t in_stack_ffffffffffffe088;
  int32_t in_stack_ffffffffffffe08c;
  int32_t in_stack_ffffffffffffe090;
  int32_t in_stack_ffffffffffffe094;
  undefined4 in_stack_ffffffffffffe098;
  undefined4 in_stack_ffffffffffffe09c;
  uint in_stack_ffffffffffffe0a0;
  undefined4 in_stack_ffffffffffffe0a4;
  uint uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  int *in_stack_ffffffffffffe0c0;
  __m256i *palVar51;
  __m256i *local_1f38;
  __m256i *in_stack_ffffffffffffe0d0;
  __m256i *palVar52;
  __m256i *local_1f28;
  long lStack_1ec8;
  __m256i local_1e60;
  __m256i local_1d80;
  __m256i local_1d60;
  __m256i local_1d40;
  __m256i local_1d00;
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c60 [32];
  longlong local_1c40;
  longlong lStack_1c38;
  longlong lStack_1c30;
  longlong lStack_1c28;
  longlong local_1c20;
  longlong lStack_1c18;
  longlong lStack_1c10;
  longlong lStack_1c08;
  longlong local_1c00;
  longlong lStack_1bf8;
  longlong lStack_1bf0;
  longlong lStack_1be8;
  longlong local_1bc0;
  longlong lStack_1bb8;
  longlong lStack_1bb0;
  longlong lStack_1ba8;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined1 local_1b40 [32];
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined1 local_1b00 [32];
  int local_1ad0;
  int local_1acc;
  int local_1ac8;
  uint local_1ac4;
  __m256i *local_1a40;
  __m256i *local_1a38;
  __m256i *local_1a30;
  __m256i *local_1a28;
  __m256i *local_1a00;
  __m256i *local_19f8;
  __m256i *local_19f0;
  __m256i *local_19e8;
  __m256i *local_19e0;
  __m256i *local_19d8;
  __m256i *local_19d0;
  __m256i *local_19c8;
  int local_1990;
  int local_198c;
  int local_1988;
  int local_1984;
  int local_1980;
  parasail_result_t *local_1960;
  ulong uStack_1938;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "profile");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x48) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "profile->profile32.score");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "profile->matrix");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "profile->s1Len");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_profile_avx2_256_32","s2");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "s2Len");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "open");
    local_1960 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_striped_profile_avx2_256_32",
            "gap");
    local_1960 = (parasail_result_t *)0x0;
  }
  else {
    local_1990 = 0;
    local_198c = *(int *)(in_RDI + 8);
    lVar3 = *(long *)(in_RDI + 0x10);
    iVar40 = (local_198c + 7) / 8;
    lVar4 = *(long *)(in_RDI + 0x48);
    lVar5 = *(long *)(in_RDI + 0x50);
    lVar6 = *(long *)(in_RDI + 0x58);
    auVar7 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar7 = vpinsrd_avx(auVar7,in_ECX,2);
    auVar7 = vpinsrd_avx(auVar7,in_ECX,3);
    auVar8 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar8 = vpinsrd_avx(auVar8,in_ECX,2);
    auVar8 = vpinsrd_avx(auVar8,in_ECX,3);
    uStack_1b0 = auVar8._0_8_;
    uStack_1a8 = auVar8._8_8_;
    auVar8 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar8 = vpinsrd_avx(auVar8,in_R8D,2);
    auVar8 = vpinsrd_avx(auVar8,in_R8D,3);
    auVar9 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar9 = vpinsrd_avx(auVar9,in_R8D,2);
    auVar9 = vpinsrd_avx(auVar9,in_R8D,3);
    uStack_170 = auVar9._0_8_;
    uStack_168 = auVar9._8_8_;
    uStack_1938 = SUB328(ZEXT832(0),4);
    uVar49 = 1;
    auVar9 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar9 = vpinsrd_avx(auVar9,1,2);
    auVar9 = vpinsrd_avx(auVar9,1,3);
    auVar10 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar10 = vpinsrd_avx(auVar10,1,2);
    auVar10 = vpinsrd_avx(auVar10,1,3);
    uStack_130 = auVar10._0_8_;
    uStack_128 = auVar10._8_8_;
    local_1ac4 = 0xc0000000;
    local_1ac8 = -0x40000000;
    local_1acc = -0x40000000;
    local_1ad0 = -0x40000000;
    local_1b00 = ZEXT832(uStack_1938) << 0x40;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_1938;
    auVar44 = auVar44 << 0x40;
    auVar46 = ZEXT816(0);
    local_1b40 = ZEXT832(uStack_1938) << 0x40;
    uVar50 = 0x7fffffff;
    auVar10 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
    auVar10 = vpinsrd_avx(auVar10,0x7fffffff,2);
    auVar10 = vpinsrd_avx(auVar10,0x7fffffff,3);
    auVar11 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
    auVar11 = vpinsrd_avx(auVar11,0x7fffffff,2);
    auVar11 = vpinsrd_avx(auVar11,0x7fffffff,3);
    auVar45 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
    iVar42 = *(int *)(lVar3 + 0x1c);
    uVar48 = in_ECX;
    local_1960 = parasail_result_new_table3(iVar40 * 8,in_EDX);
    if (local_1960 == (parasail_result_t *)0x0) {
      local_1960 = (parasail_result_t *)0x0;
    }
    else {
      local_1960->flag = local_1960->flag | 0x8410804;
      local_1960->flag = local_1960->flag | 0x20000;
      local_19c8 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_19d0 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_19d8 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_19e0 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_19e8 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_19f0 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_19f8 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_1a00 = parasail_memalign___m256i(0x20,(long)iVar40);
      ptr = parasail_memalign___m256i(0x20,(long)iVar40);
      ptr_00 = parasail_memalign___m256i(0x20,(long)iVar40);
      ptr_01 = parasail_memalign___m256i(0x20,(long)iVar40);
      ptr_02 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_1a28 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_1a30 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_1a38 = parasail_memalign___m256i(0x20,(long)iVar40);
      local_1a40 = parasail_memalign___m256i(0x20,(long)iVar40);
      if (local_19c8 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_19d0 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_19d8 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_19e0 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_19e8 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_19f0 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_19f8 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_1a00 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (ptr_02 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_1a28 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_1a30 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_1a38 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else if (local_1a40 == (__m256i *)0x0) {
        local_1960 = (parasail_result_t *)0x0;
      }
      else {
        alVar23[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar23[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar23[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar23[1]._4_4_ = in_stack_ffffffffffffe0a4;
        alVar23[2]._0_4_ = uVar48;
        alVar23[2]._4_4_ = in_R8D;
        alVar23[3]._0_4_ = uVar49;
        alVar23[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar23,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        alVar24[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar24[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar24[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar24[1]._4_4_ = in_stack_ffffffffffffe0a4;
        alVar24[2]._0_4_ = uVar48;
        alVar24[2]._4_4_ = in_R8D;
        alVar24[3]._0_4_ = uVar49;
        alVar24[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar24,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        alVar25[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar25[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar25[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar25[1]._4_4_ = in_stack_ffffffffffffe0a4;
        alVar25[2]._0_4_ = uVar48;
        alVar25[2]._4_4_ = in_R8D;
        alVar25[3]._0_4_ = uVar49;
        alVar25[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar25,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        alVar26[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar26[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar26[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar26[1]._4_4_ = in_stack_ffffffffffffe0a4;
        alVar26[2]._0_4_ = uVar48;
        alVar26[2]._4_4_ = in_R8D;
        alVar26[3]._0_4_ = uVar49;
        alVar26[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar26,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        uVar41 = -in_ECX;
        auVar12 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
        auVar12 = vpinsrd_avx(auVar12,uVar41,2);
        auVar12 = vpinsrd_avx(auVar12,uVar41,3);
        auVar47 = ZEXT1664(auVar12);
        auVar12 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
        auVar12 = vpinsrd_avx(auVar12,uVar41,2);
        vpinsrd_avx(auVar12,uVar41,3);
        alVar27[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar27[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar27[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar27[1]._4_4_ = uVar41;
        alVar27[2]._0_4_ = uVar48;
        alVar27[2]._4_4_ = in_R8D;
        alVar27[3]._0_4_ = uVar49;
        alVar27[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar27,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        alVar28[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar28[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar28[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar28[1]._4_4_ = uVar41;
        alVar28[2]._0_4_ = uVar48;
        alVar28[2]._4_4_ = in_R8D;
        alVar28[3]._0_4_ = uVar49;
        alVar28[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar28,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        alVar29[0]._4_4_ = in_stack_ffffffffffffe09c;
        alVar29[0]._0_4_ = in_stack_ffffffffffffe098;
        alVar29[1]._0_4_ = in_stack_ffffffffffffe0a0;
        alVar29[1]._4_4_ = uVar41;
        alVar29[2]._0_4_ = uVar48;
        alVar29[2]._4_4_ = in_R8D;
        alVar29[3]._0_4_ = uVar49;
        alVar29[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,alVar29,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        c[0]._4_4_ = in_stack_ffffffffffffe09c;
        c[0]._0_4_ = in_stack_ffffffffffffe098;
        c[1]._0_4_ = in_stack_ffffffffffffe0a0;
        c[1]._4_4_ = uVar41;
        c[2]._0_4_ = uVar48;
        c[2]._4_4_ = in_R8D;
        c[3]._0_4_ = uVar49;
        c[3]._4_4_ = uVar50;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe0d0,c,
                   CONCAT44(in_stack_ffffffffffffe094,in_stack_ffffffffffffe090));
        local_1984 = 0;
        while( true ) {
          palVar39 = local_19c8;
          palVar38 = local_19d8;
          palVar37 = local_19e8;
          palVar36 = local_19f8;
          palVar35 = local_1a28;
          palVar34 = local_1a30;
          palVar52 = local_1a38;
          palVar51 = local_1a40;
          uStack_1b08 = auVar46._8_8_;
          uStack_1b10 = auVar46._0_8_;
          uStack_1b48 = auVar45._8_8_;
          uStack_1b50 = auVar45._0_8_;
          if (in_EDX <= local_1984) break;
          local_1c60 = ZEXT832(uStack_1938) << 0x40;
          local_1ca0 = ZEXT832(uStack_1938) << 0x40;
          local_1cc0 = ZEXT832(uStack_1938) << 0x40;
          local_1ce0._16_8_ = uStack_130;
          local_1ce0._0_16_ = auVar9;
          local_1ce0._24_8_ = uStack_128;
          auVar22 = vperm2i128_avx2(auVar47._0_32_,(undefined1  [32])local_19c8[iVar40 + -1],0x28);
          local_1d00 = (__m256i)vpalignr_avx2((undefined1  [32])local_19c8[iVar40 + -1],auVar22,0xc)
          ;
          auVar22 = vperm2i128_avx2(auVar22,(undefined1  [32])local_19d8[iVar40 + -1],0x28);
          local_1d40 = (__m256i)vpalignr_avx2((undefined1  [32])local_19d8[iVar40 + -1],auVar22,0xc)
          ;
          auVar22 = vperm2i128_avx2(auVar22,(undefined1  [32])local_19e8[iVar40 + -1],0x28);
          local_1d60 = (__m256i)vpalignr_avx2((undefined1  [32])local_19e8[iVar40 + -1],auVar22,0xc)
          ;
          auVar22 = vperm2i128_avx2(auVar22,(undefined1  [32])local_19f8[iVar40 + -1],0x28);
          local_1d80 = (__m256i)vpalignr_avx2((undefined1  [32])local_19f8[iVar40 + -1],auVar22,0xc)
          ;
          lVar43 = lVar4 + (long)(*(int *)(*(long *)(lVar3 + 0x10) +
                                          (ulong)*(byte *)(in_RSI + local_1984) * 4) * iVar40) *
                           0x20;
          iVar1 = *(int *)(*(long *)(lVar3 + 0x10) + (ulong)*(byte *)(in_RSI + local_1984) * 4);
          iVar2 = *(int *)(*(long *)(lVar3 + 0x10) + (ulong)*(byte *)(in_RSI + local_1984) * 4);
          if (local_1990 == local_1984 + -2) {
            local_1a28 = local_19d0;
            local_19c8 = palVar35;
            local_1a30 = local_19e0;
            local_19d8 = palVar34;
            local_1a38 = local_19f0;
            local_19e8 = palVar52;
            local_1a40 = local_1a00;
            local_19f8 = palVar51;
          }
          else {
            local_19c8 = local_19d0;
            local_19d8 = local_19e0;
            local_19e8 = local_19f0;
            local_19f8 = local_1a00;
          }
          local_19d0 = palVar39;
          local_19e0 = palVar38;
          local_19f0 = palVar37;
          local_1a00 = palVar36;
          for (local_1980 = 0; auVar47 = ZEXT3264(auVar22), local_1980 < iVar40;
              local_1980 = local_1980 + 1) {
            alVar26 = ptr[local_1980];
            alVar27 = ptr_00[local_1980];
            alVar23 = ptr_00[local_1980];
            alVar28 = ptr_01[local_1980];
            alVar24 = ptr_01[local_1980];
            alVar29 = ptr_02[local_1980];
            alVar25 = ptr_02[local_1980];
            auVar22 = vpaddd_avx2((undefined1  [32])local_1d00,
                                  *(undefined1 (*) [32])(lVar43 + (long)local_1980 * 0x20));
            auVar22 = vpmaxsd_avx2(auVar22,ZEXT832(uStack_1938) << 0x40);
            auVar18 = vpmaxsd_avx2(auVar22,(undefined1  [32])ptr[local_1980]);
            auVar19 = vpmaxsd_avx2(auVar18,local_1c60);
            palVar51 = local_19c8 + local_1980;
            local_1d00[0] = auVar19._0_8_;
            local_1d00[1] = auVar19._8_8_;
            local_1d00[2] = auVar19._16_8_;
            local_1d00[3] = auVar19._24_8_;
            (*palVar51)[0] = local_1d00[0];
            (*palVar51)[1] = local_1d00[1];
            (*palVar51)[2] = local_1d00[2];
            (*palVar51)[3] = local_1d00[3];
            auVar15 = vpcmpeqd_avx2(auVar19,ZEXT832(uStack_1938) << 0x40);
            auVar16 = vpcmpeqd_avx2(auVar19,auVar22);
            auVar17 = vpcmpeqd_avx2(auVar19,local_1c60);
            auVar18 = vpblendvb_avx2((undefined1  [32])alVar23,local_1ca0,auVar17);
            auVar22 = vpaddd_avx2((undefined1  [32])local_1d40,
                                  *(undefined1 (*) [32])
                                   (lVar5 + (long)(iVar1 * iVar40) * 0x20 + (long)local_1980 * 0x20)
                                 );
            auVar22 = vpblendvb_avx2(auVar18,auVar22,auVar16);
            auVar13 = vpandn_avx2(auVar15,auVar22);
            palVar51 = local_19d8 + local_1980;
            local_1d40[0] = auVar13._0_8_;
            local_1d40[1] = auVar13._8_8_;
            local_1d40[2] = auVar13._16_8_;
            local_1d40[3] = auVar13._24_8_;
            (*palVar51)[0] = local_1d40[0];
            (*palVar51)[1] = local_1d40[1];
            (*palVar51)[2] = local_1d40[2];
            (*palVar51)[3] = local_1d40[3];
            auVar18 = vpblendvb_avx2((undefined1  [32])alVar24,local_1cc0,auVar17);
            auVar22 = vpaddd_avx2((undefined1  [32])local_1d60,
                                  *(undefined1 (*) [32])
                                   (lVar6 + (long)(iVar2 * iVar40) * 0x20 + (long)local_1980 * 0x20)
                                 );
            auVar22 = vpblendvb_avx2(auVar18,auVar22,auVar16);
            auVar14 = vpandn_avx2(auVar15,auVar22);
            palVar51 = local_19e8 + local_1980;
            local_1d60[0] = auVar14._0_8_;
            local_1d60[1] = auVar14._8_8_;
            local_1d60[2] = auVar14._16_8_;
            local_1d60[3] = auVar14._24_8_;
            (*palVar51)[0] = local_1d60[0];
            (*palVar51)[1] = local_1d60[1];
            (*palVar51)[2] = local_1d60[2];
            (*palVar51)[3] = local_1d60[3];
            auVar18 = vpblendvb_avx2((undefined1  [32])alVar25,local_1ce0,auVar17);
            auVar17._16_8_ = uStack_130;
            auVar17._0_16_ = auVar9;
            auVar17._24_8_ = uStack_128;
            auVar22 = vpaddd_avx2((undefined1  [32])local_1d80,auVar17);
            auVar22 = vpblendvb_avx2(auVar18,auVar22,auVar16);
            auVar15 = vpandn_avx2(auVar15,auVar22);
            palVar51 = local_19f8 + local_1980;
            local_1d80[0] = auVar15._0_8_;
            local_1d80[1] = auVar15._8_8_;
            local_1d80[2] = auVar15._16_8_;
            local_1d80[3] = auVar15._24_8_;
            (*palVar51)[0] = local_1d80[0];
            (*palVar51)[1] = local_1d80[1];
            (*palVar51)[2] = local_1d80[2];
            (*palVar51)[3] = local_1d80[3];
            auVar22 = vpmaxsd_avx2(local_1b40,auVar13);
            auVar22 = vpmaxsd_avx2(auVar22,auVar14);
            local_1b40 = vpmaxsd_avx2(auVar22,auVar15);
            vH_00[0]._4_4_ = in_stack_ffffffffffffe09c;
            vH_00[0]._0_4_ = in_stack_ffffffffffffe098;
            vH_00[1]._0_4_ = in_stack_ffffffffffffe0a0;
            vH_00[1]._4_4_ = uVar41;
            vH_00[2]._0_4_ = uVar48;
            vH_00[2]._4_4_ = in_R8D;
            vH_00[3]._0_4_ = uVar49;
            vH_00[3]._4_4_ = uVar50;
            arr_store(in_stack_ffffffffffffe0c0,vH_00,in_stack_ffffffffffffe094,
                      in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088)
            ;
            vH_01[0]._4_4_ = in_stack_ffffffffffffe09c;
            vH_01[0]._0_4_ = in_stack_ffffffffffffe098;
            vH_01[1]._0_4_ = in_stack_ffffffffffffe0a0;
            vH_01[1]._4_4_ = uVar41;
            vH_01[2]._0_4_ = uVar48;
            vH_01[2]._4_4_ = in_R8D;
            vH_01[3]._0_4_ = uVar49;
            vH_01[3]._4_4_ = uVar50;
            arr_store(in_stack_ffffffffffffe0c0,vH_01,in_stack_ffffffffffffe094,
                      in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088)
            ;
            vH_02[0]._4_4_ = in_stack_ffffffffffffe09c;
            vH_02[0]._0_4_ = in_stack_ffffffffffffe098;
            vH_02[1]._0_4_ = in_stack_ffffffffffffe0a0;
            vH_02[1]._4_4_ = uVar41;
            vH_02[2]._0_4_ = uVar48;
            vH_02[2]._4_4_ = in_R8D;
            vH_02[3]._0_4_ = uVar49;
            vH_02[3]._4_4_ = uVar50;
            arr_store(in_stack_ffffffffffffe0c0,vH_02,in_stack_ffffffffffffe094,
                      in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088)
            ;
            vH_03[0]._4_4_ = in_stack_ffffffffffffe09c;
            vH_03[0]._0_4_ = in_stack_ffffffffffffe098;
            vH_03[1]._0_4_ = in_stack_ffffffffffffe0a0;
            vH_03[1]._4_4_ = uVar41;
            vH_03[2]._0_4_ = uVar48;
            vH_03[2]._4_4_ = in_R8D;
            vH_03[3]._0_4_ = uVar49;
            vH_03[3]._4_4_ = uVar50;
            arr_store(in_stack_ffffffffffffe0c0,vH_03,in_stack_ffffffffffffe094,
                      in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088)
            ;
            local_1b00 = vpmaxsd_avx2(auVar19,local_1b00);
            auVar20._16_8_ = uStack_1b0;
            auVar20._0_16_ = auVar7;
            auVar20._24_8_ = uStack_1a8;
            auVar21 = vpsubd_avx2(auVar19,auVar20);
            auVar19._16_8_ = uStack_170;
            auVar19._0_16_ = auVar8;
            auVar19._24_8_ = uStack_168;
            auVar22 = vpsubd_avx2((undefined1  [32])alVar26,auVar19);
            auVar20 = vpmaxsd_avx2(auVar21,auVar22);
            auVar19 = vpcmpgtd_avx2(auVar21,auVar22);
            auVar16 = vpblendvb_avx2((undefined1  [32])alVar27,auVar13,auVar19);
            auVar17 = vpblendvb_avx2((undefined1  [32])alVar28,auVar14,auVar19);
            auVar32._16_8_ = uStack_130;
            auVar32._0_16_ = auVar9;
            auVar32._24_8_ = uStack_128;
            auVar22 = vpaddd_avx2((undefined1  [32])alVar29,auVar32);
            auVar31._16_8_ = uStack_130;
            auVar31._0_16_ = auVar9;
            auVar31._24_8_ = uStack_128;
            auVar18 = vpaddd_avx2(auVar15,auVar31);
            auVar22 = vpblendvb_avx2(auVar22,auVar18,auVar19);
            palVar51 = ptr + local_1980;
            local_1bc0 = auVar20._0_8_;
            lStack_1bb8 = auVar20._8_8_;
            lStack_1bb0 = auVar20._16_8_;
            lStack_1ba8 = auVar20._24_8_;
            (*palVar51)[0] = local_1bc0;
            (*palVar51)[1] = lStack_1bb8;
            (*palVar51)[2] = lStack_1bb0;
            (*palVar51)[3] = lStack_1ba8;
            palVar51 = ptr_00 + local_1980;
            local_1c00 = auVar16._0_8_;
            lStack_1bf8 = auVar16._8_8_;
            lStack_1bf0 = auVar16._16_8_;
            lStack_1be8 = auVar16._24_8_;
            (*palVar51)[0] = local_1c00;
            (*palVar51)[1] = lStack_1bf8;
            (*palVar51)[2] = lStack_1bf0;
            (*palVar51)[3] = lStack_1be8;
            palVar51 = ptr_01 + local_1980;
            local_1c20 = auVar17._0_8_;
            lStack_1c18 = auVar17._8_8_;
            lStack_1c10 = auVar17._16_8_;
            lStack_1c08 = auVar17._24_8_;
            (*palVar51)[0] = local_1c20;
            (*palVar51)[1] = lStack_1c18;
            (*palVar51)[2] = lStack_1c10;
            (*palVar51)[3] = lStack_1c08;
            palVar51 = ptr_02 + local_1980;
            local_1c40 = auVar22._0_8_;
            lStack_1c38 = auVar22._8_8_;
            lStack_1c30 = auVar22._16_8_;
            lStack_1c28 = auVar22._24_8_;
            (*palVar51)[0] = local_1c40;
            (*palVar51)[1] = lStack_1c38;
            (*palVar51)[2] = lStack_1c30;
            (*palVar51)[3] = lStack_1c28;
            auVar16._16_8_ = uStack_170;
            auVar16._0_16_ = auVar8;
            auVar16._24_8_ = uStack_168;
            auVar22 = vpsubd_avx2(local_1c60,auVar16);
            local_1c60 = vpmaxsd_avx2(auVar21,auVar22);
            auVar16 = vpcmpgtd_avx2(auVar21,auVar22);
            local_1ca0 = vpblendvb_avx2(local_1ca0,auVar13,auVar16);
            local_1cc0 = vpblendvb_avx2(local_1cc0,auVar14,auVar16);
            auVar18._16_8_ = uStack_130;
            auVar18._0_16_ = auVar9;
            auVar18._24_8_ = uStack_128;
            auVar18 = vpaddd_avx2(local_1ce0,auVar18);
            auVar22._16_8_ = uStack_130;
            auVar22._0_16_ = auVar9;
            auVar22._24_8_ = uStack_128;
            auVar22 = vpaddd_avx2(auVar15,auVar22);
            local_1ce0 = vpblendvb_avx2(auVar18,auVar22,auVar16);
            local_1d00 = palVar39[local_1980];
            local_1d40 = palVar38[local_1980];
            local_1d60 = palVar37[local_1980];
            local_1d80 = palVar36[local_1980];
          }
          for (local_1988 = 0; local_1988 < 8; local_1988 = local_1988 + 1) {
            auVar22 = vperm2i128_avx2(auVar47._0_32_,(undefined1  [32])palVar39[iVar40 + -1],0x28);
            local_1e60 = (__m256i)vpalignr_avx2((undefined1  [32])palVar39[iVar40 + -1],auVar22,0xc)
            ;
            auVar22 = vperm2i128_avx2(auVar22,local_1c60,0x28);
            auVar22 = vpalignr_avx2(local_1c60,auVar22,0xc);
            local_1c60 = vpblendd_avx2(auVar22,ZEXT432(-in_ECX),1);
            auVar22 = vperm2i128_avx2(ZEXT432(-in_ECX),local_1ca0,0x28);
            local_1ca0 = vpalignr_avx2(local_1ca0,auVar22,0xc);
            auVar22 = vperm2i128_avx2(auVar22,local_1cc0,0x28);
            local_1cc0 = vpalignr_avx2(local_1cc0,auVar22,0xc);
            auVar22 = vperm2i128_avx2(auVar22,local_1ce0,0x28);
            auVar22 = vpalignr_avx2(local_1ce0,auVar22,0xc);
            auVar47 = ZEXT1664(ZEXT416(1));
            local_1ce0 = vpblendd_avx2(auVar22,ZEXT1632(ZEXT416(1)),1);
            for (local_1980 = 0; local_1980 < iVar40; local_1980 = local_1980 + 1) {
              auVar22 = vpaddd_avx2((undefined1  [32])local_1e60,
                                    *(undefined1 (*) [32])(lVar43 + (long)local_1980 * 0x20));
              auVar22 = vpmaxsd_avx2(auVar22,ZEXT832(uStack_1938) << 0x40);
              auVar15 = vpmaxsd_avx2((undefined1  [32])local_19c8[local_1980],local_1c60);
              palVar51 = local_19c8 + local_1980;
              local_1d00[0] = auVar15._0_8_;
              local_1d00[1] = auVar15._8_8_;
              local_1d00[2] = auVar15._16_8_;
              local_1d00[3] = auVar15._24_8_;
              (*palVar51)[0] = local_1d00[0];
              (*palVar51)[1] = local_1d00[1];
              (*palVar51)[2] = local_1d00[2];
              (*palVar51)[3] = local_1d00[3];
              auVar22 = vpcmpeqd_avx2(auVar15,auVar22);
              auVar18 = vpcmpeqd_avx2(auVar15,local_1c60);
              auVar22 = vpandn_avx2(auVar22,auVar18);
              auVar18 = vpblendvb_avx2((undefined1  [32])local_19d8[local_1980],local_1ca0,auVar22);
              palVar51 = local_19d8 + local_1980;
              local_1d40[0] = auVar18._0_8_;
              local_1d40[1] = auVar18._8_8_;
              local_1d40[2] = auVar18._16_8_;
              local_1d40[3] = auVar18._24_8_;
              (*palVar51)[0] = local_1d40[0];
              (*palVar51)[1] = local_1d40[1];
              (*palVar51)[2] = local_1d40[2];
              (*palVar51)[3] = local_1d40[3];
              auVar13 = vpblendvb_avx2((undefined1  [32])local_19e8[local_1980],local_1cc0,auVar22);
              palVar51 = local_19e8 + local_1980;
              local_1d60[0] = auVar13._0_8_;
              local_1d60[1] = auVar13._8_8_;
              local_1d60[2] = auVar13._16_8_;
              local_1d60[3] = auVar13._24_8_;
              (*palVar51)[0] = local_1d60[0];
              (*palVar51)[1] = local_1d60[1];
              (*palVar51)[2] = local_1d60[2];
              (*palVar51)[3] = local_1d60[3];
              auVar14 = vpblendvb_avx2((undefined1  [32])local_19f8[local_1980],local_1ce0,auVar22);
              palVar51 = local_19f8 + local_1980;
              local_1d80[0] = auVar14._0_8_;
              local_1d80[1] = auVar14._8_8_;
              local_1d80[2] = auVar14._16_8_;
              local_1d80[3] = auVar14._24_8_;
              (*palVar51)[0] = local_1d80[0];
              (*palVar51)[1] = local_1d80[1];
              (*palVar51)[2] = local_1d80[2];
              (*palVar51)[3] = local_1d80[3];
              auVar22 = vpmaxsd_avx2(local_1b40,auVar18);
              auVar22 = vpmaxsd_avx2(auVar22,auVar13);
              local_1b40 = vpmaxsd_avx2(auVar22,auVar14);
              vH_04[0]._4_4_ = in_stack_ffffffffffffe09c;
              vH_04[0]._0_4_ = in_stack_ffffffffffffe098;
              vH_04[1]._0_4_ = in_stack_ffffffffffffe0a0;
              vH_04[1]._4_4_ = uVar41;
              vH_04[2]._0_4_ = uVar48;
              vH_04[2]._4_4_ = in_R8D;
              vH_04[3]._0_4_ = uVar49;
              vH_04[3]._4_4_ = uVar50;
              arr_store(in_stack_ffffffffffffe0c0,vH_04,in_stack_ffffffffffffe094,
                        in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
                        in_stack_ffffffffffffe088);
              vH_05[0]._4_4_ = in_stack_ffffffffffffe09c;
              vH_05[0]._0_4_ = in_stack_ffffffffffffe098;
              vH_05[1]._0_4_ = in_stack_ffffffffffffe0a0;
              vH_05[1]._4_4_ = uVar41;
              vH_05[2]._0_4_ = uVar48;
              vH_05[2]._4_4_ = in_R8D;
              vH_05[3]._0_4_ = uVar49;
              vH_05[3]._4_4_ = uVar50;
              arr_store(in_stack_ffffffffffffe0c0,vH_05,in_stack_ffffffffffffe094,
                        in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
                        in_stack_ffffffffffffe088);
              vH_06[0]._4_4_ = in_stack_ffffffffffffe09c;
              vH_06[0]._0_4_ = in_stack_ffffffffffffe098;
              vH_06[1]._0_4_ = in_stack_ffffffffffffe0a0;
              vH_06[1]._4_4_ = uVar41;
              vH_06[2]._0_4_ = uVar48;
              vH_06[2]._4_4_ = in_R8D;
              vH_06[3]._0_4_ = uVar49;
              vH_06[3]._4_4_ = uVar50;
              arr_store(in_stack_ffffffffffffe0c0,vH_06,in_stack_ffffffffffffe094,
                        in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
                        in_stack_ffffffffffffe088);
              vH_07[0]._4_4_ = in_stack_ffffffffffffe09c;
              vH_07[0]._0_4_ = in_stack_ffffffffffffe098;
              vH_07[1]._0_4_ = in_stack_ffffffffffffe0a0;
              vH_07[1]._4_4_ = uVar41;
              vH_07[2]._0_4_ = uVar48;
              vH_07[2]._4_4_ = in_R8D;
              vH_07[3]._0_4_ = uVar49;
              vH_07[3]._4_4_ = uVar50;
              arr_store(in_stack_ffffffffffffe0c0,vH_07,in_stack_ffffffffffffe094,
                        in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
                        in_stack_ffffffffffffe088);
              local_1b00 = vpmaxsd_avx2(auVar15,local_1b00);
              auVar21._16_8_ = uStack_1b0;
              auVar21._0_16_ = auVar7;
              auVar21._24_8_ = uStack_1a8;
              auVar17 = vpsubd_avx2(auVar15,auVar21);
              auVar15._16_8_ = uStack_170;
              auVar15._0_16_ = auVar8;
              auVar15._24_8_ = uStack_168;
              local_1c60 = vpsubd_avx2(local_1c60,auVar15);
              auVar15 = vpcmpgtd_avx2(local_1c60,auVar17);
              auVar22 = vpcmpeqd_avx2(local_1c60,auVar17);
              auVar16 = vpcmpgtd_avx2(local_1c60,ZEXT832(uStack_1938) << 0x40);
              auVar22 = vpand_avx2(auVar22,auVar16);
              auVar22 = vpor_avx2(auVar15,auVar22);
              if ((((((((((((((((((((((((((((((((auVar22 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar22 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar22 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar22 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar22 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar22 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar22 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar22 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar22 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar22 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar22 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar22 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar22 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar22 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar22 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar22 >> 0x7f,0) == '\0') &&
                                (auVar22 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar22 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar22 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar22 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar22 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar22 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar22 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar22 >> 0xbf,0) == '\0') &&
                        (auVar22 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar22 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar22 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar22 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar22 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar22 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar22[0x1f]) goto LAB_00d96465;
              auVar15 = vpcmpgtd_avx2(auVar17,local_1c60);
              local_1ca0 = vpblendvb_avx2(local_1ca0,auVar18,auVar15);
              local_1cc0 = vpblendvb_avx2(local_1cc0,auVar13,auVar15);
              auVar30._16_8_ = uStack_130;
              auVar30._0_16_ = auVar9;
              auVar30._24_8_ = uStack_128;
              auVar22 = vpaddd_avx2(local_1ce0,auVar30);
              auVar13._16_8_ = uStack_130;
              auVar13._0_16_ = auVar9;
              auVar13._24_8_ = uStack_128;
              auVar18 = vpaddd_avx2(auVar14,auVar13);
              auVar47 = ZEXT3264(auVar18);
              local_1ce0 = vpblendvb_avx2(auVar22,auVar18,auVar15);
              local_1e60 = palVar39[local_1980];
            }
          }
LAB_00d96465:
          auVar14._16_8_ = uStack_1b10;
          auVar14._0_16_ = auVar44;
          auVar14._24_8_ = uStack_1b08;
          auVar47 = ZEXT3264(auVar14);
          auVar22 = vpcmpgtd_avx2(local_1b00,auVar14);
          lStack_1ec8 = auVar22._24_8_;
          if ((((((((((((((((((((((((((((((((auVar22 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar22 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar22 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar22 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar22 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar22 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar22 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar22 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar22 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar22 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar22 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar22 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar22 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar22 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar22 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar22 >> 0x7f,0) != '\0') ||
                            (auVar22 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar22 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar22 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar22 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar22 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar22 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar22 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar22 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_1ec8 < 0
             ) {
            a[1] = in_stack_ffffffffffffe080;
            a[0] = 0xd964de;
            a[2]._0_4_ = in_stack_ffffffffffffe088;
            a[2]._4_4_ = in_stack_ffffffffffffe08c;
            a[3]._0_4_ = in_stack_ffffffffffffe090;
            a[3]._4_4_ = in_stack_ffffffffffffe094;
            in_stack_ffffffffffffe0a0 = _mm256_hmax_epi32_rpl(a);
            local_1ac4 = in_stack_ffffffffffffe0a0;
            if (0x7fffffff - (iVar42 + 1) < (int)in_stack_ffffffffffffe0a0) {
              local_1960->flag = local_1960->flag | 0x40;
              break;
            }
            auVar44 = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe0a0),in_stack_ffffffffffffe0a0,1);
            auVar44 = vpinsrd_avx(auVar44,in_stack_ffffffffffffe0a0,2);
            auVar46 = vpinsrd_avx(auVar44,in_stack_ffffffffffffe0a0,3);
            auVar47 = ZEXT1664(auVar46);
            auVar44 = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe0a0),in_stack_ffffffffffffe0a0,1);
            auVar44 = vpinsrd_avx(auVar44,in_stack_ffffffffffffe0a0,2);
            auVar44 = vpinsrd_avx(auVar44,in_stack_ffffffffffffe0a0,3);
            auVar44 = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar44;
            auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
            local_1990 = local_1984;
          }
          local_1984 = local_1984 + 1;
        }
        palVar35 = local_1a28;
        palVar34 = local_1a30;
        palVar52 = local_1a38;
        palVar51 = local_1a40;
        if ((local_1ac4 == 0x7fffffff) ||
           (auVar33._16_8_ = uStack_1b50,
           auVar33._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar11,
           auVar33._24_8_ = uStack_1b48, auVar22 = vpcmpeqd_avx2(local_1b40,auVar33),
           (((((((((((((((((((((((((((((((auVar22 >> 7 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0 ||
                                        (auVar22 >> 0xf & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar22 >> 0x17 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar22 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar22 >> 0x27 & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar22 >> 0x2f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar22 >> 0x37 & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar22 >> 0x47 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar22 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar22 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar22 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar22 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar22 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          SUB321(auVar22 >> 0x7f,0) != '\0') ||
                         (auVar22 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar22 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar22 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar22 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(auVar22 >> 0xbf,0) != '\0') ||
                 (auVar22 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar22 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar22 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar22 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           auVar22[0x1f] < '\0')) {
          local_1960->flag = local_1960->flag | 0x40;
        }
        iVar42 = parasail_result_is_saturated(local_1960);
        if (iVar42 == 0) {
          if (local_1990 == local_1984 + -1) {
            local_1a28 = local_19c8;
            local_19c8 = palVar35;
            local_1a30 = local_19d8;
            local_19d8 = palVar34;
            local_1a38 = local_19e8;
            local_19e8 = palVar52;
            local_1a40 = local_19f8;
            local_19f8 = palVar51;
          }
          else if (local_1990 == local_1984 + -2) {
            local_1a28 = local_19d0;
            local_19d0 = palVar35;
            local_1a30 = local_19e0;
            local_19e0 = palVar34;
            local_1a38 = local_19f0;
            local_19f0 = palVar52;
            local_1a40 = local_1a00;
            local_1a00 = palVar51;
          }
          local_1f28 = local_1a28;
          local_1f38 = local_1a38;
          palVar51 = local_1a40;
          palVar52 = local_1a30;
          for (local_1980 = 0; local_1980 < iVar40 * 8; local_1980 = local_1980 + 1) {
            if (((uint)(*local_1f28)[0] == local_1ac4) &&
               (iVar42 = local_1980 / 8 + (local_1980 % 8) * iVar40, iVar42 < local_198c)) {
              local_1ac8 = (int)(*palVar52)[0];
              local_1acc = (int)(*local_1f38)[0];
              local_1ad0 = (int)(*palVar51)[0];
              local_198c = iVar42;
            }
            local_1f28 = (__m256i *)((long)*local_1f28 + 4);
            palVar52 = (__m256i *)((long)*palVar52 + 4);
            local_1f38 = (__m256i *)((long)*local_1f38 + 4);
            palVar51 = (__m256i *)((long)*palVar51 + 4);
          }
        }
        else {
          local_1ac4 = 0;
          local_198c = 0;
          local_1990 = 0;
          local_1ac8 = 0;
          local_1acc = 0;
          local_1ad0 = 0;
        }
        local_1960->score = local_1ac4;
        local_1960->end_query = local_198c;
        local_1960->end_ref = local_1990;
        ((local_1960->field_4).stats)->matches = local_1ac8;
        ((local_1960->field_4).stats)->similar = local_1acc;
        ((local_1960->field_4).stats)->length = local_1ad0;
        parasail_free(local_1a40);
        parasail_free(local_1a38);
        parasail_free(local_1a30);
        parasail_free(local_1a28);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(local_1a00);
        parasail_free(local_19f8);
        parasail_free(local_19f0);
        parasail_free(local_19e8);
        parasail_free(local_19e0);
        parasail_free(local_19d8);
        parasail_free(local_19d0);
        parasail_free(local_19c8);
      }
    }
  }
  return local_1960;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile32.score;
    vProfileM = (__m256i*)profile->profile32.matches;
    vProfileS = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm256_set1_epi32(INT32_MAX);
    maxp = INT32_MAX - (int32_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);
        vHM = _mm256_slli_si256_rpl(vHM, 4);
        vHS = _mm256_slli_si256_rpl(vHS, 4);
        vHL = _mm256_slli_si256_rpl(vHL, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH_dag = _mm256_max_epi32(vH_dag, vZero);
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi32(vH, vZero);

            case1 = _mm256_cmpeq_epi32(vH, vH_dag);
            case2 = _mm256_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi32(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_andnot_si256(cond_zero, vHM);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi32(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_andnot_si256(cond_zero, vHS);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi32(vHL, vOne), case1);
            vHL = _mm256_andnot_si256(cond_zero, vHL);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vEL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vFL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, -open, 0);
            vFM = _mm256_slli_si256_rpl(vFM, 4);
            vFS = _mm256_slli_si256_rpl(vFS, 4);
            vFL = _mm256_slli_si256_rpl(vFL, 4);
            vFL = _mm256_insert_epi32_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                vHp = _mm256_max_epi32(vHp, vZero);
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi32(vH, vHp);
                case2 = _mm256_cmpeq_epi32(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi32(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi32(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi32(vFL, vOne),
                        _mm256_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT32_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi32(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t *m = (int32_t*)pvHMMax;
            int32_t *s = (int32_t*)pvHSMax;
            int32_t *l = (int32_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}